

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

uint32 BranchBailOutRecord::BailOutFromLoopBodyInlined
                 (JavascriptCallStackLayout *layout,BranchBailOutRecord *bailOutRecord,BOOL cond,
                 void *returnAddress)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  uint32 *puVar5;
  Var branchValue;
  
  if ((bailOutRecord->super_BailOutRecord).parent == (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0xb8d,"(bailOutRecord->parent != nullptr)",
                       "bailOutRecord->parent != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  puVar5 = &(bailOutRecord->super_BailOutRecord).bailOutOffset;
  if (cond == 0) {
    puVar5 = &bailOutRecord->falseBailOutOffset;
  }
  if ((bailOutRecord->super_BailOutRecord).branchValueRegSlot == 0xffffffff) {
    branchValue = (Var)0x0;
  }
  else {
    branchValue = *(Var *)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)layout + 8) + 8) + 0x490
                                              ) + 8) + 1000 + (ulong)(cond == 0) * 8);
  }
  uVar3 = BailOutRecord::BailOutFromLoopBodyInlinedCommon
                    (layout,&bailOutRecord->super_BailOutRecord,*puVar5,returnAddress,
                     (bailOutRecord->super_BailOutRecord).bailOutKind,branchValue);
  return uVar3;
}

Assistant:

uint32
BranchBailOutRecord::BailOutFromLoopBodyInlined(Js::JavascriptCallStackLayout * layout, BranchBailOutRecord const * bailOutRecord, BOOL cond, void * returnAddress)
{
    Assert(bailOutRecord->parent != nullptr);
    uint32 bailOutOffset = cond? bailOutRecord->bailOutOffset : bailOutRecord->falseBailOutOffset;
    Js::Var branchValue = nullptr;
    if (bailOutRecord->branchValueRegSlot != Js::Constants::NoRegister)
    {
        Js::ScriptContext *scriptContext = layout->functionObject->GetScriptContext();
        branchValue = (cond ? scriptContext->GetLibrary()->GetTrue() : scriptContext->GetLibrary()->GetFalse());
    }
    return __super::BailOutFromLoopBodyInlinedCommon(layout, bailOutRecord, bailOutOffset, returnAddress, bailOutRecord->bailOutKind, branchValue);
}